

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O1

void av1_cdef_fb_row(AV1_COMMON *cm,MACROBLOCKD *xd,uint16_t **linebuf,uint16_t **colbuf,
                    uint16_t *src,int fbr,cdef_init_fb_row_t cdef_init_fb_row_fn,
                    AV1CdefSyncData *cdef_sync,aom_internal_error_info *error_info)

{
  undefined4 *puVar1;
  _Bool _Var2;
  uint8_t uVar3;
  uint uVar4;
  MB_MODE_INFO *pMVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  int mi_row;
  int iVar11;
  int iVar12;
  int iVar13;
  uint16_t *puVar14;
  byte bVar15;
  byte bVar16;
  int iVar17;
  uint16_t *puVar18;
  uint16_t *puVar19;
  int mi_col;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint16_t *puVar25;
  uint8_t *dst8;
  uint16_t *puVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  uint uVar35;
  int iVar36;
  int iVar37;
  undefined1 auVar38 [16];
  long lVar40;
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar64;
  int iVar65;
  int iVar71;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int iVar72;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar73;
  int iVar77;
  undefined1 in_XMM8 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  int cdef_left [3];
  int level [2];
  CdefBlockInfo fb_info;
  
  cdef_left[0] = 1;
  cdef_left[1] = 1;
  cdef_left[2] = 1;
  iVar11 = (cm->mi_params).mi_cols;
  iVar22 = iVar11 + 0x1e;
  if (-1 < iVar11 + 0xf) {
    iVar22 = iVar11 + 0xf;
  }
  (*cdef_init_fb_row_fn)(cm,xd,&fb_info,linebuf,src,cdef_sync,fbr);
  if ((cdef_sync == (AV1CdefSyncData *)0x0) || ((cm->cdef_info).allocated_num_workers < 2)) {
    if (iVar11 < 1) {
      return;
    }
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)cdef_sync->mutex_);
    _Var2 = cdef_sync->cdef_mt_exit;
    pthread_mutex_unlock((pthread_mutex_t *)cdef_sync->mutex_);
    if (iVar11 < 1 || _Var2 != false) {
      return;
    }
  }
  iVar22 = iVar22 >> 4;
  mi_row = fbr * 0x10;
  iVar11 = 1;
  if (1 < iVar22) {
    iVar11 = iVar22;
  }
  iVar21 = 0;
  do {
    fb_info.frame_boundary[1] = (int)(iVar21 == 0);
    if (iVar21 == iVar22 + -1) {
      fb_info.frame_boundary[3] = 1;
    }
    else {
      fb_info.frame_boundary[3] = (int)(iVar21 * 0x10 + 0x10 == (cm->mi_params).mi_cols);
    }
    mi_col = iVar21 * 0x10;
    pMVar5 = (cm->mi_params).mi_grid_base[(cm->mi_params).mi_stride * mi_row + mi_col];
    uVar3 = cm->seq_params->monochrome;
    uVar35 = (uint)(uVar3 == '\0') * 2 + 1;
    level[0] = 0;
    level[1] = 0;
    if ((pMVar5 == (MB_MODE_INFO *)0x0) ||
       (uVar33 = (int)(short)(*(short *)&pMVar5->field_0xa7 * 2) & 0xff000, uVar33 == 0xff000)) {
LAB_0039183c:
      memset(cdef_left,0,(ulong)(uVar35 * 4));
    }
    else {
      iVar17 = (int)(uVar33 << 0xc) >> 0x18;
      uVar33 = (cm->cdef_info).cdef_strengths[iVar17];
      uVar20 = uVar33;
      if ((int)uVar33 < 0) {
        uVar20 = uVar33 + 3;
      }
      iVar23 = (int)uVar33 % 4;
      if ((int)uVar33 % 4 == 3) {
        iVar23 = 4;
      }
      level[1] = 0;
      level[0] = (int)uVar20 >> 2;
      bVar10 = true;
      if (uVar3 == '\0') {
        uVar4 = (cm->cdef_info).cdef_uv_strengths[iVar17];
        uVar27 = uVar4;
        if ((int)uVar4 < 0) {
          uVar27 = uVar4 + 3;
        }
        iVar17 = (int)uVar4 % 4;
        if (iVar17 == 3) {
          iVar17 = 4;
        }
        level[1] = (int)uVar27 >> 2;
        bVar10 = iVar17 == 0 && uVar4 + 3 < 7;
      }
      if ((uVar33 + 3 < 7 && iVar23 == 0) && bVar10) goto LAB_0039183c;
      fb_info.cdef_count =
           av1_cdef_compute_sb_list(&cm->mi_params,mi_row,mi_col,fb_info.dlist,BLOCK_64X64);
      if (fb_info.cdef_count == 0) goto LAB_0039183c;
      uVar34 = 0;
      do {
        puVar26 = fb_info.src;
        if ((uVar34 == 0) || (!bVar10)) {
          fb_info.level = level[uVar34 != 0];
          fb_info.sec_strength = level[(ulong)(uVar34 != 0) - 2];
          fb_info.dst = xd->plane[uVar34].dst.buf;
          fb_info.dst_stride = xd->plane[uVar34].dst.stride;
          fb_info.xdec = xd->plane[uVar34].subsampling_x;
          fb_info.ydec = xd->plane[uVar34].subsampling_y;
          fb_info.mi_wide_l2 = 2 - fb_info.xdec;
          fb_info.mi_high_l2 = 2 - fb_info.ydec;
          bVar15 = (byte)fb_info.mi_high_l2;
          fb_info.roffset = mi_row << (bVar15 & 0x1f);
          bVar16 = (byte)fb_info.mi_wide_l2;
          fb_info.coffset = mi_col << (bVar16 & 0x1f);
          iVar17 = cdef_left[uVar34];
          iVar23 = (cm->mi_params).mi_rows;
          iVar65 = (cm->mi_params).mi_cols;
          iVar12 = iVar23 + 0x1e;
          if (-1 < iVar23 + 0xf) {
            iVar12 = iVar23 + 0xf;
          }
          iVar13 = iVar65 + 0x1e;
          if (-1 < iVar65 + 0xf) {
            iVar13 = iVar65 + 0xf;
          }
          iVar32 = iVar65 + iVar21 * -0x10;
          if (0xf < iVar32) {
            iVar32 = 0x10;
          }
          iVar23 = iVar23 + fbr * -0x10;
          if (0xf < iVar23) {
            iVar23 = 0x10;
          }
          bVar16 = bVar16 & 0x1f;
          uVar33 = iVar32 << bVar16;
          iVar23 = iVar23 << (bVar15 & 0x1f);
          if (uVar34 == 0) {
            bVar15 = 0;
          }
          else {
            bVar15 = (byte)cm->seq_params->subsampling_x;
          }
          iVar24 = (uint)(iVar17 != 0) * 8 + -8;
          puVar14 = fb_info.top_linebuf[uVar34];
          iVar37 = (int)(iVar65 * 4 + 0xfU & 0xfffffff0) >> (bVar15 & 0x1f);
          puVar18 = fb_info.bot_linebuf[uVar34];
          iVar65 = (iVar23 + 2) * 0x90;
          iVar13 = (iVar13 >> 4) + -1;
          uVar20 = uVar33 + 8;
          if (iVar13 == iVar21) {
            uVar20 = uVar33;
          }
          iVar36 = (iVar12 >> 4) + -1;
          av1_cdef_copy_sb8_16
                    (cm,fb_info.src + (long)iVar24 + 0x128,0x90,fb_info.dst,fb_info.roffset,
                     fb_info.coffset + iVar24,fb_info.dst_stride,iVar23,uVar20 - iVar24);
          auVar9 = _DAT_004d46d0;
          auVar8 = _DAT_004d46c0;
          auVar79 = _DAT_004d2ad0;
          auVar7 = _DAT_004d2ac0;
          auVar6 = _DAT_004d2ab0;
          uVar28 = (ulong)uVar33;
          iVar12 = iVar23 + 2;
          if (iVar36 == fbr) {
            iVar12 = iVar23;
          }
          if (fbr < iVar36) {
            puVar19 = puVar18 + fb_info.coffset;
            puVar25 = puVar26 + (long)iVar65 + 8;
            lVar29 = 0;
            do {
              if (0 < iVar32 << bVar16) {
                uVar31 = 0;
                do {
                  puVar25[uVar31] = puVar19[uVar31];
                  uVar31 = uVar31 + 1;
                } while (uVar28 != uVar31);
              }
              lVar29 = lVar29 + 1;
              puVar25 = puVar25 + 0x90;
              puVar19 = puVar19 + iVar37;
            } while (lVar29 != 2);
          }
          else {
            lVar29 = uVar28 - 1;
            auVar45._8_4_ = (int)lVar29;
            auVar45._0_8_ = lVar29;
            auVar45._12_4_ = (int)((ulong)lVar29 >> 0x20);
            puVar19 = puVar26 + (long)iVar65 + 0xf;
            lVar29 = 0;
            do {
              if (0 < iVar32 << bVar16) {
                lVar30 = 0;
                auVar76 = auVar7;
                auVar80 = auVar6;
                auVar49 = auVar9;
                auVar50 = auVar8;
                do {
                  auVar61 = auVar45 ^ auVar79;
                  auVar54 = auVar76 ^ auVar79;
                  iVar24 = auVar61._0_4_;
                  iVar73 = -(uint)(iVar24 < auVar54._0_4_);
                  iVar72 = auVar61._4_4_;
                  auVar55._4_4_ = -(uint)(iVar72 < auVar54._4_4_);
                  iVar64 = auVar61._8_4_;
                  iVar77 = -(uint)(iVar64 < auVar54._8_4_);
                  iVar71 = auVar61._12_4_;
                  auVar55._12_4_ = -(uint)(iVar71 < auVar54._12_4_);
                  auVar66._4_4_ = iVar73;
                  auVar66._0_4_ = iVar73;
                  auVar66._8_4_ = iVar77;
                  auVar66._12_4_ = iVar77;
                  auVar78 = pshuflw(in_XMM9,auVar66,0xe8);
                  auVar61._4_4_ = -(uint)(auVar54._4_4_ == iVar72);
                  auVar61._12_4_ = -(uint)(auVar54._12_4_ == iVar71);
                  auVar61._0_4_ = auVar61._4_4_;
                  auVar61._8_4_ = auVar61._12_4_;
                  auVar54 = pshuflw(auVar79,auVar61,0xe8);
                  auVar55._0_4_ = auVar55._4_4_;
                  auVar55._8_4_ = auVar55._12_4_;
                  auVar79 = pshuflw(auVar78,auVar55,0xe8);
                  auVar79 = (auVar79 | auVar54 & auVar78) ^ _DAT_004e6ab0;
                  auVar79 = packssdw(auVar79,auVar79);
                  if ((auVar79 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined2 *)((long)puVar19 + lVar30 + -0xe) = 0x4000;
                  }
                  auVar55 = auVar61 & auVar66 | auVar55;
                  auVar79 = packssdw(auVar55,auVar55);
                  auVar79 = packssdw(auVar79 ^ _DAT_004e6ab0,auVar79 ^ _DAT_004e6ab0);
                  if ((auVar79._0_4_ >> 0x10 & 1) != 0) {
                    *(undefined2 *)((long)puVar19 + lVar30 + -0xc) = 0x4000;
                  }
                  auVar79 = _DAT_004d2ad0;
                  auVar61 = auVar80 ^ _DAT_004d2ad0;
                  iVar73 = -(uint)(iVar24 < auVar61._0_4_);
                  auVar74._4_4_ = -(uint)(iVar72 < auVar61._4_4_);
                  iVar77 = -(uint)(iVar64 < auVar61._8_4_);
                  auVar74._12_4_ = -(uint)(iVar71 < auVar61._12_4_);
                  auVar54._4_4_ = iVar73;
                  auVar54._0_4_ = iVar73;
                  auVar54._8_4_ = iVar77;
                  auVar54._12_4_ = iVar77;
                  auVar78._4_4_ = -(uint)(auVar61._4_4_ == iVar72);
                  auVar78._12_4_ = -(uint)(auVar61._12_4_ == iVar71);
                  auVar78._0_4_ = auVar78._4_4_;
                  auVar78._8_4_ = auVar78._12_4_;
                  auVar74._0_4_ = auVar74._4_4_;
                  auVar74._8_4_ = auVar74._12_4_;
                  auVar61 = auVar78 & auVar54 | auVar74;
                  auVar61 = packssdw(auVar61,auVar61);
                  auVar61 = packssdw(auVar61 ^ _DAT_004e6ab0,auVar61 ^ _DAT_004e6ab0);
                  if ((auVar61 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    *(undefined2 *)((long)puVar19 + lVar30 + -10) = 0x4000;
                  }
                  auVar54 = pshufhw(auVar54,auVar54,0x84);
                  auVar66 = pshufhw(auVar78,auVar78,0x84);
                  auVar55 = pshufhw(auVar54,auVar74,0x84);
                  auVar54 = (auVar55 | auVar66 & auVar54) ^ _DAT_004e6ab0;
                  auVar54 = packssdw(auVar54,auVar54);
                  if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    *(undefined2 *)((long)puVar19 + lVar30 + -8) = 0x4000;
                  }
                  auVar54 = auVar49 ^ auVar79;
                  iVar73 = -(uint)(iVar24 < auVar54._0_4_);
                  auVar57._4_4_ = -(uint)(iVar72 < auVar54._4_4_);
                  iVar77 = -(uint)(iVar64 < auVar54._8_4_);
                  auVar57._12_4_ = -(uint)(iVar71 < auVar54._12_4_);
                  auVar67._4_4_ = iVar73;
                  auVar67._0_4_ = iVar73;
                  auVar67._8_4_ = iVar77;
                  auVar67._12_4_ = iVar77;
                  auVar61 = pshuflw(auVar61,auVar67,0xe8);
                  auVar56._4_4_ = -(uint)(auVar54._4_4_ == iVar72);
                  auVar56._12_4_ = -(uint)(auVar54._12_4_ == iVar71);
                  auVar56._0_4_ = auVar56._4_4_;
                  auVar56._8_4_ = auVar56._12_4_;
                  auVar54 = pshuflw(auVar79,auVar56,0xe8);
                  auVar57._0_4_ = auVar57._4_4_;
                  auVar57._8_4_ = auVar57._12_4_;
                  auVar79 = pshuflw(auVar61,auVar57,0xe8);
                  auVar79 = (auVar79 | auVar54 & auVar61) ^ _DAT_004e6ab0;
                  auVar79 = packssdw(auVar79,auVar79);
                  if ((auVar79 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined2 *)((long)puVar19 + lVar30 + -6) = 0x4000;
                  }
                  auVar57 = auVar56 & auVar67 | auVar57;
                  auVar79 = packssdw(auVar57,auVar57);
                  auVar79 = packssdw(auVar79 ^ _DAT_004e6ab0,auVar79 ^ _DAT_004e6ab0);
                  if ((auVar79 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    *(undefined2 *)((long)puVar19 + lVar30 + -4) = 0x4000;
                  }
                  auVar79 = _DAT_004d2ad0;
                  auVar61 = auVar50 ^ _DAT_004d2ad0;
                  auVar75._0_4_ = -(uint)(iVar24 < auVar61._0_4_);
                  auVar75._4_4_ = -(uint)(iVar72 < auVar61._4_4_);
                  auVar75._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
                  auVar75._12_4_ = -(uint)(iVar71 < auVar61._12_4_);
                  auVar58._4_4_ = auVar75._0_4_;
                  auVar58._0_4_ = auVar75._0_4_;
                  auVar58._8_4_ = auVar75._8_4_;
                  auVar58._12_4_ = auVar75._8_4_;
                  iVar24 = -(uint)(auVar61._4_4_ == iVar72);
                  iVar72 = -(uint)(auVar61._12_4_ == iVar71);
                  auVar44._4_4_ = iVar24;
                  auVar44._0_4_ = iVar24;
                  auVar44._8_4_ = iVar72;
                  auVar44._12_4_ = iVar72;
                  auVar68._4_4_ = auVar75._4_4_;
                  auVar68._0_4_ = auVar75._4_4_;
                  auVar68._8_4_ = auVar75._12_4_;
                  auVar68._12_4_ = auVar75._12_4_;
                  in_XMM9 = auVar44 & auVar58 | auVar68;
                  auVar61 = packssdw(auVar75,in_XMM9);
                  in_XMM8 = packssdw(auVar61 ^ _DAT_004e6ab0,auVar61 ^ _DAT_004e6ab0);
                  if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    *(undefined2 *)((long)puVar19 + lVar30 + -2) = 0x4000;
                  }
                  auVar54 = pshufhw(auVar58,auVar58,0x84);
                  auVar61 = pshufhw(auVar44,auVar44,0x84);
                  auVar55 = pshufhw(auVar54,auVar68,0x84);
                  auVar61 = packssdw(auVar61 & auVar54,(auVar55 | auVar61 & auVar54) ^ _DAT_004e6ab0
                                    );
                  if ((auVar61 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    *(undefined2 *)((long)puVar19 + lVar30) = 0x4000;
                  }
                  lVar40 = auVar76._8_8_;
                  auVar76._0_8_ = auVar76._0_8_ + 8;
                  auVar76._8_8_ = lVar40 + 8;
                  lVar40 = auVar80._8_8_;
                  auVar80._0_8_ = auVar80._0_8_ + 8;
                  auVar80._8_8_ = lVar40 + 8;
                  lVar40 = auVar49._8_8_;
                  auVar49._0_8_ = auVar49._0_8_ + 8;
                  auVar49._8_8_ = lVar40 + 8;
                  lVar40 = auVar50._8_8_;
                  auVar50._0_8_ = auVar50._0_8_ + 8;
                  auVar50._8_8_ = lVar40 + 8;
                  lVar30 = lVar30 + 0x10;
                } while ((ulong)(uVar33 + 7 >> 3) << 4 != lVar30);
              }
              lVar29 = lVar29 + 1;
              puVar19 = puVar19 + 0x90;
            } while (lVar29 != 2);
          }
          puVar19 = puVar26 + iVar65;
          if ((iVar21 == 0) || (iVar36 <= fbr)) {
            lVar29 = 0;
            do {
              puVar1 = (undefined4 *)((long)puVar19 + lVar29);
              *puVar1 = 0x40004000;
              puVar1[1] = 0x40004000;
              puVar1[2] = 0x40004000;
              puVar1[3] = 0x40004000;
              lVar29 = lVar29 + 0x120;
            } while (lVar29 != 0x240);
          }
          else {
            puVar25 = puVar18 + (long)fb_info.coffset + -8;
            lVar29 = 0;
            do {
              lVar30 = 0;
              do {
                puVar19[lVar30] = puVar25[lVar30];
                lVar30 = lVar30 + 1;
              } while (lVar30 != 8);
              lVar29 = lVar29 + 1;
              puVar19 = puVar19 + 0x90;
              puVar25 = puVar25 + iVar37;
            } while (lVar29 != 2);
          }
          if ((iVar21 < iVar13) && (fbr < iVar36)) {
            puVar19 = puVar26 + (long)(int)(iVar65 + uVar33) + 8;
            puVar18 = puVar18 + (long)(int)uVar33 + (long)fb_info.coffset;
            lVar29 = 0;
            do {
              lVar30 = 0;
              do {
                puVar19[lVar30] = puVar18[lVar30];
                lVar30 = lVar30 + 1;
              } while (lVar30 != 8);
              lVar29 = lVar29 + 1;
              puVar19 = puVar19 + 0x90;
              puVar18 = puVar18 + iVar37;
            } while (lVar29 != 2);
          }
          else {
            lVar29 = 0x10;
            do {
              puVar1 = (undefined4 *)((long)puVar26 + lVar29 + (long)(int)(iVar65 + uVar33) * 2);
              *puVar1 = 0x40004000;
              puVar1[1] = 0x40004000;
              puVar1[2] = 0x40004000;
              puVar1[3] = 0x40004000;
              lVar29 = lVar29 + 0x120;
            } while (lVar29 != 0x250);
          }
          if (fbr < 1) {
            lVar29 = uVar28 - 1;
            auVar38._8_4_ = (int)lVar29;
            auVar38._0_8_ = lVar29;
            auVar38._12_4_ = (int)((ulong)lVar29 >> 0x20);
            puVar18 = puVar26 + 0xf;
            auVar38 = auVar38 ^ auVar79;
            lVar29 = 0;
            do {
              if (0 < iVar32 << bVar16) {
                lVar30 = 0;
                auVar39 = auVar7;
                auVar41 = auVar6;
                auVar42 = auVar9;
                auVar43 = auVar8;
                do {
                  auVar45 = auVar39 ^ auVar79;
                  iVar65 = auVar38._0_4_;
                  iVar64 = -(uint)(iVar65 < auVar45._0_4_);
                  iVar24 = auVar38._4_4_;
                  auVar47._4_4_ = -(uint)(iVar24 < auVar45._4_4_);
                  iVar36 = auVar38._8_4_;
                  iVar71 = -(uint)(iVar36 < auVar45._8_4_);
                  iVar72 = auVar38._12_4_;
                  auVar47._12_4_ = -(uint)(iVar72 < auVar45._12_4_);
                  auVar59._4_4_ = iVar64;
                  auVar59._0_4_ = iVar64;
                  auVar59._8_4_ = iVar71;
                  auVar59._12_4_ = iVar71;
                  auVar76 = pshuflw(in_XMM8,auVar59,0xe8);
                  auVar46._4_4_ = -(uint)(auVar45._4_4_ == iVar24);
                  auVar46._12_4_ = -(uint)(auVar45._12_4_ == iVar72);
                  auVar46._0_4_ = auVar46._4_4_;
                  auVar46._8_4_ = auVar46._12_4_;
                  auVar80 = pshuflw(in_XMM9,auVar46,0xe8);
                  auVar47._0_4_ = auVar47._4_4_;
                  auVar47._8_4_ = auVar47._12_4_;
                  auVar45 = pshuflw(auVar76,auVar47,0xe8);
                  auVar45 = (auVar45 | auVar80 & auVar76) ^ _DAT_004e6ab0;
                  auVar45 = packssdw(auVar45,auVar45);
                  if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined2 *)((long)puVar18 + lVar30 + -0xe) = 0x4000;
                  }
                  auVar47 = auVar46 & auVar59 | auVar47;
                  auVar45 = packssdw(auVar47,auVar47);
                  auVar45 = packssdw(auVar45 ^ _DAT_004e6ab0,auVar45 ^ _DAT_004e6ab0);
                  if ((auVar45._0_4_ >> 0x10 & 1) != 0) {
                    *(undefined2 *)((long)puVar18 + lVar30 + -0xc) = 0x4000;
                  }
                  auVar45 = auVar41 ^ auVar79;
                  iVar64 = -(uint)(iVar65 < auVar45._0_4_);
                  auVar69._4_4_ = -(uint)(iVar24 < auVar45._4_4_);
                  iVar71 = -(uint)(iVar36 < auVar45._8_4_);
                  auVar69._12_4_ = -(uint)(iVar72 < auVar45._12_4_);
                  auVar48._4_4_ = iVar64;
                  auVar48._0_4_ = iVar64;
                  auVar48._8_4_ = iVar71;
                  auVar48._12_4_ = iVar71;
                  auVar60._4_4_ = -(uint)(auVar45._4_4_ == iVar24);
                  auVar60._12_4_ = -(uint)(auVar45._12_4_ == iVar72);
                  auVar60._0_4_ = auVar60._4_4_;
                  auVar60._8_4_ = auVar60._12_4_;
                  auVar69._0_4_ = auVar69._4_4_;
                  auVar69._8_4_ = auVar69._12_4_;
                  auVar45 = auVar60 & auVar48 | auVar69;
                  auVar45 = packssdw(auVar45,auVar45);
                  auVar45 = packssdw(auVar45 ^ _DAT_004e6ab0,auVar45 ^ _DAT_004e6ab0);
                  if ((auVar45 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    *(undefined2 *)((long)puVar18 + lVar30 + -10) = 0x4000;
                  }
                  auVar49 = pshufhw(auVar48,auVar48,0x84);
                  auVar61 = pshufhw(auVar60,auVar60,0x84);
                  auVar50 = pshufhw(auVar49,auVar69,0x84);
                  auVar49 = (auVar50 | auVar61 & auVar49) ^ _DAT_004e6ab0;
                  auVar49 = packssdw(auVar49,auVar49);
                  if ((auVar49 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    *(undefined2 *)((long)puVar18 + lVar30 + -8) = 0x4000;
                  }
                  auVar49 = auVar42 ^ auVar79;
                  iVar64 = -(uint)(iVar65 < auVar49._0_4_);
                  auVar52._4_4_ = -(uint)(iVar24 < auVar49._4_4_);
                  iVar71 = -(uint)(iVar36 < auVar49._8_4_);
                  auVar52._12_4_ = -(uint)(iVar72 < auVar49._12_4_);
                  auVar62._4_4_ = iVar64;
                  auVar62._0_4_ = iVar64;
                  auVar62._8_4_ = iVar71;
                  auVar62._12_4_ = iVar71;
                  auVar45 = pshuflw(auVar45,auVar62,0xe8);
                  auVar51._4_4_ = -(uint)(auVar49._4_4_ == iVar24);
                  auVar51._12_4_ = -(uint)(auVar49._12_4_ == iVar72);
                  auVar51._0_4_ = auVar51._4_4_;
                  auVar51._8_4_ = auVar51._12_4_;
                  in_XMM9 = pshuflw(auVar80 & auVar76,auVar51,0xe8);
                  in_XMM9 = in_XMM9 & auVar45;
                  auVar52._0_4_ = auVar52._4_4_;
                  auVar52._8_4_ = auVar52._12_4_;
                  auVar45 = pshuflw(auVar45,auVar52,0xe8);
                  auVar45 = (auVar45 | in_XMM9) ^ _DAT_004e6ab0;
                  auVar45 = packssdw(auVar45,auVar45);
                  if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined2 *)((long)puVar18 + lVar30 + -6) = 0x4000;
                  }
                  auVar52 = auVar51 & auVar62 | auVar52;
                  auVar45 = packssdw(auVar52,auVar52);
                  auVar45 = packssdw(auVar45 ^ _DAT_004e6ab0,auVar45 ^ _DAT_004e6ab0);
                  if ((auVar45 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    *(undefined2 *)((long)puVar18 + lVar30 + -4) = 0x4000;
                  }
                  auVar45 = auVar43 ^ auVar79;
                  iVar65 = -(uint)(iVar65 < auVar45._0_4_);
                  auVar70._4_4_ = -(uint)(iVar24 < auVar45._4_4_);
                  iVar36 = -(uint)(iVar36 < auVar45._8_4_);
                  auVar70._12_4_ = -(uint)(iVar72 < auVar45._12_4_);
                  auVar53._4_4_ = iVar65;
                  auVar53._0_4_ = iVar65;
                  auVar53._8_4_ = iVar36;
                  auVar53._12_4_ = iVar36;
                  auVar63._4_4_ = -(uint)(auVar45._4_4_ == iVar24);
                  auVar63._12_4_ = -(uint)(auVar45._12_4_ == iVar72);
                  auVar63._0_4_ = auVar63._4_4_;
                  auVar63._8_4_ = auVar63._12_4_;
                  auVar70._0_4_ = auVar70._4_4_;
                  auVar70._8_4_ = auVar70._12_4_;
                  auVar45 = auVar63 & auVar53 | auVar70;
                  auVar45 = packssdw(auVar45,auVar45);
                  in_XMM8 = packssdw(auVar45 ^ _DAT_004e6ab0,auVar45 ^ _DAT_004e6ab0);
                  if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    *(undefined2 *)((long)puVar18 + lVar30 + -2) = 0x4000;
                  }
                  auVar45 = pshufhw(auVar53,auVar53,0x84);
                  auVar80 = pshufhw(auVar63,auVar63,0x84);
                  auVar76 = pshufhw(auVar45,auVar70,0x84);
                  auVar45 = (auVar76 | auVar80 & auVar45) ^ _DAT_004e6ab0;
                  auVar45 = packssdw(auVar45,auVar45);
                  if ((auVar45 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    *(undefined2 *)((long)puVar18 + lVar30) = 0x4000;
                  }
                  lVar40 = auVar39._8_8_;
                  auVar39._0_8_ = auVar39._0_8_ + 8;
                  auVar39._8_8_ = lVar40 + 8;
                  lVar40 = auVar41._8_8_;
                  auVar41._0_8_ = auVar41._0_8_ + 8;
                  auVar41._8_8_ = lVar40 + 8;
                  lVar40 = auVar42._8_8_;
                  auVar42._0_8_ = auVar42._0_8_ + 8;
                  auVar42._8_8_ = lVar40 + 8;
                  lVar40 = auVar43._8_8_;
                  auVar43._0_8_ = auVar43._0_8_ + 8;
                  auVar43._8_8_ = lVar40 + 8;
                  lVar30 = lVar30 + 0x10;
                } while ((ulong)(uVar33 + 7 >> 3) << 4 != lVar30);
              }
              lVar29 = lVar29 + 1;
              puVar18 = puVar18 + 0x90;
            } while (lVar29 != 2);
          }
          else {
            puVar18 = puVar26 + 8;
            puVar19 = puVar14 + fb_info.coffset;
            lVar29 = 0;
            do {
              if (0 < iVar32 << bVar16) {
                uVar31 = 0;
                do {
                  puVar18[uVar31] = puVar19[uVar31];
                  uVar31 = uVar31 + 1;
                } while (uVar28 != uVar31);
              }
              lVar29 = lVar29 + 1;
              puVar18 = puVar18 + 0x90;
              puVar19 = puVar19 + iVar37;
            } while (lVar29 != 2);
          }
          if (iVar21 == 0 || fbr < 1) {
            lVar29 = 0;
            do {
              puVar1 = (undefined4 *)((long)puVar26 + lVar29);
              *puVar1 = 0x40004000;
              puVar1[1] = 0x40004000;
              puVar1[2] = 0x40004000;
              puVar1[3] = 0x40004000;
              lVar29 = lVar29 + 0x120;
            } while (lVar29 != 0x240);
          }
          else {
            puVar19 = puVar14 + (long)fb_info.coffset + -8;
            lVar29 = 0;
            puVar18 = puVar26;
            do {
              lVar30 = 0;
              do {
                puVar18[lVar30] = puVar19[lVar30];
                lVar30 = lVar30 + 1;
              } while (lVar30 != 8);
              lVar29 = lVar29 + 1;
              puVar18 = puVar18 + 0x90;
              puVar19 = puVar19 + iVar37;
            } while (lVar29 != 2);
          }
          puVar18 = puVar26 + (int)uVar33;
          if ((fbr < 1) || (iVar13 <= iVar21)) {
            lVar29 = 0x10;
            do {
              puVar1 = (undefined4 *)((long)puVar18 + lVar29);
              *puVar1 = 0x40004000;
              puVar1[1] = 0x40004000;
              puVar1[2] = 0x40004000;
              puVar1[3] = 0x40004000;
              lVar29 = lVar29 + 0x120;
            } while (lVar29 != 0x250);
          }
          else {
            puVar14 = puVar14 + (long)(int)uVar33 + (long)fb_info.coffset;
            lVar29 = 0;
            puVar19 = puVar26 + (long)(int)uVar33 + 8;
            do {
              lVar30 = 0;
              do {
                puVar19[lVar30] = puVar14[lVar30];
                lVar30 = lVar30 + 1;
              } while (lVar30 != 8);
              lVar29 = lVar29 + 1;
              puVar19 = puVar19 + 0x90;
              puVar14 = puVar14 + iVar37;
            } while (lVar29 != 2);
          }
          if ((iVar17 != 0) && (-2 < iVar12)) {
            puVar14 = colbuf[uVar34];
            uVar28 = 0;
            puVar19 = puVar26;
            do {
              lVar29 = 0;
              do {
                puVar19[lVar29] = puVar14[lVar29];
                lVar29 = lVar29 + 1;
              } while (lVar29 != 8);
              uVar28 = uVar28 + 1;
              puVar19 = puVar19 + 0x90;
              puVar14 = puVar14 + 8;
            } while (uVar28 != iVar12 + 2);
          }
          if (-2 < iVar12) {
            puVar14 = colbuf[uVar34];
            uVar28 = 0;
            do {
              lVar29 = 0;
              do {
                puVar14[lVar29] = puVar18[lVar29];
                lVar29 = lVar29 + 1;
              } while (lVar29 != 8);
              uVar28 = uVar28 + 1;
              puVar14 = puVar14 + 8;
              puVar18 = puVar18 + 0x90;
            } while (uVar28 != iVar12 + 2);
          }
          if ((fb_info.frame_boundary[1] != 0) && (-4 < iVar23)) {
            lVar29 = 0;
            do {
              puVar1 = (undefined4 *)((long)puVar26 + lVar29);
              *puVar1 = 0x40004000;
              puVar1[1] = 0x40004000;
              puVar1[2] = 0x40004000;
              puVar1[3] = 0x40004000;
              lVar29 = lVar29 + 0x120;
            } while ((ulong)(iVar23 + 4) * 0x120 != lVar29);
          }
          if ((fb_info.frame_boundary[3] != 0) && (-4 < iVar23)) {
            lVar29 = 0;
            do {
              puVar1 = (undefined4 *)((long)(puVar26 + (long)(int)uVar33 + 8) + lVar29);
              *puVar1 = 0x40004000;
              puVar1[1] = 0x40004000;
              puVar1[2] = 0x40004000;
              puVar1[3] = 0x40004000;
              lVar29 = lVar29 + 0x120;
            } while ((ulong)(iVar23 + 4) * 0x120 != lVar29);
          }
          dst8 = fb_info.dst +
                 (long)fb_info.coffset + (long)fb_info.roffset * (long)fb_info.dst_stride;
          if (cm->seq_params->use_highbitdepth == '\0') {
            puVar26 = (uint16_t *)0x0;
          }
          else {
            puVar26 = (uint16_t *)((long)dst8 * 2);
            dst8 = (uint8_t *)0x0;
          }
          av1_cdef_filter_fb(dst8,puVar26,fb_info.dst_stride,fb_info.src + 0x128,fb_info.xdec,
                             fb_info.ydec,fb_info.dir,(int *)0x0,fb_info.var,(int)uVar34,
                             fb_info.dlist,fb_info.cdef_count,fb_info.level,fb_info.sec_strength,
                             fb_info.damping,fb_info.coeff_shift);
          cdef_left[uVar34] = 1;
        }
        else {
          cdef_left[uVar34] = 0;
        }
        uVar34 = uVar34 + 1;
      } while (uVar34 != uVar35);
    }
    iVar21 = iVar21 + 1;
    if (iVar21 == iVar11) {
      return;
    }
  } while( true );
}

Assistant:

void av1_cdef_fb_row(const AV1_COMMON *const cm, MACROBLOCKD *xd,
                     uint16_t **const linebuf, uint16_t **const colbuf,
                     uint16_t *const src, int fbr,
                     cdef_init_fb_row_t cdef_init_fb_row_fn,
                     struct AV1CdefSyncData *const cdef_sync,
                     struct aom_internal_error_info *error_info) {
  // TODO(aomedia:3276): Pass error_info to the low-level functions as required
  // in future to handle error propagation.
  (void)error_info;
  CdefBlockInfo fb_info;
  int cdef_left[MAX_MB_PLANE] = { 1, 1, 1 };
  const int nhfb = (cm->mi_params.mi_cols + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;

  cdef_init_fb_row_fn(cm, xd, &fb_info, linebuf, src, cdef_sync, fbr);
#if CONFIG_MULTITHREAD
  if (cdef_sync && cm->cdef_info.allocated_num_workers > 1) {
    pthread_mutex_lock(cdef_sync->mutex_);
    const bool cdef_mt_exit = cdef_sync->cdef_mt_exit;
    pthread_mutex_unlock(cdef_sync->mutex_);
    // Exit in case any worker has encountered an error.
    if (cdef_mt_exit) return;
  }
#endif
  for (int fbc = 0; fbc < nhfb; fbc++) {
    fb_info.frame_boundary[LEFT] = (MI_SIZE_64X64 * fbc == 0) ? 1 : 0;
    if (fbc != nhfb - 1)
      fb_info.frame_boundary[RIGHT] =
          (MI_SIZE_64X64 * (fbc + 1) == cm->mi_params.mi_cols) ? 1 : 0;
    else
      fb_info.frame_boundary[RIGHT] = 1;
    cdef_fb_col(cm, xd, &fb_info, colbuf, &cdef_left[0], fbc, fbr);
  }
}